

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O2

bool __thiscall
helics::InputInfo::addSource
          (InputInfo *this,GlobalHandle newSource,string_view sourceName,string_view stype,
          string_view sunits)

{
  pointer pGVar1;
  pointer pTVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  GlobalHandle newSource_local;
  string_view stype_local;
  string_view sourceName_local;
  value_type local_30;
  
  stype_local._M_str = stype._M_str;
  stype_local._M_len = stype._M_len;
  sourceName_local._M_str = sourceName._M_str;
  sourceName_local._M_len = sourceName._M_len;
  lVar5 = -0x20;
  lVar3 = -0x40;
  lVar4 = 0;
  while( true ) {
    pGVar1 = (pointer)((long)&(((this->input_sources).
                                super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
                                ._M_impl.super__Vector_impl_data._M_start)->fed_id).gid + lVar4);
    newSource_local = newSource;
    if (pGVar1 == (this->input_sources).
                  super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      (this->inputUnits)._M_string_length = 0;
      *(this->inputUnits)._M_dataplus._M_p = '\0';
      (this->inputType)._M_string_length = 0;
      *(this->inputType)._M_dataplus._M_p = '\0';
      std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::push_back
                (&this->input_sources,&newSource_local);
      std::
      vector<helics::InputInfo::sourceInformation,std::allocator<helics::InputInfo::sourceInformation>>
      ::
      emplace_back<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                ((vector<helics::InputInfo::sourceInformation,std::allocator<helics::InputInfo::sourceInformation>>
                  *)&this->source_info,&sourceName_local,&stype_local,&sunits);
      std::
      vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
      ::resize(&this->data_queues,
               (long)(this->input_sources).
                     super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->input_sources).
                     super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3);
      std::
      vector<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
      ::resize(&this->current_data,
               (long)(this->input_sources).
                     super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->input_sources).
                     super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3);
      local_30.first.internalTimeCode = -0x7fffffffffffffff;
      local_30.second = 0;
      std::
      vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_>_>
      ::resize(&this->current_data_time,
               (long)(this->input_sources).
                     super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->input_sources).
                     super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3,&local_30);
      local_30.first.internalTimeCode = 0x7fffffffffffffff;
      std::
      vector<TimeRepresentation<count_time<9,long>>,std::allocator<TimeRepresentation<count_time<9,long>>>>
      ::emplace_back<TimeRepresentation<count_time<9,long>>>
                ((vector<TimeRepresentation<count_time<9,long>>,std::allocator<TimeRepresentation<count_time<9,long>>>>
                  *)&this->deactivated,&local_30.first);
      this->has_target = true;
      return true;
    }
    if (((pGVar1->fed_id).gid == newSource.fed_id.gid.gid) &&
       ((pGVar1->handle).hid == newSource.handle.hid.hid)) break;
    lVar4 = lVar4 + 8;
    lVar5 = lVar5 + -0x60;
    lVar3 = lVar3 + -0x60;
  }
  pTVar2 = (this->deactivated).
           super__Vector_base<TimeRepresentation<count_time<9,_long>_>,_std::allocator<TimeRepresentation<count_time<9,_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (*(long *)((long)&pTVar2->internalTimeCode + lVar4) != 0x7fffffffffffffff) {
    *(undefined8 *)((long)&pTVar2->internalTimeCode + lVar4) = 0x7fffffffffffffff;
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)
               ((long)(this->source_info).
                      super__Vector_base<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
                      ._M_impl.super__Vector_impl_data._M_start - lVar3),&sunits);
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)
               ((long)(this->source_info).
                      super__Vector_base<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
                      ._M_impl.super__Vector_impl_data._M_start - lVar5),&sunits);
    return true;
  }
  return false;
}

Assistant:

bool InputInfo::addSource(GlobalHandle newSource,
                          std::string_view sourceName,
                          std::string_view stype,
                          std::string_view sunits)
{
    int index{0};
    for (const auto& is : input_sources) {
        if (is == newSource) {
            if (deactivated[index] < Time::maxVal()) {
                // this is a reconnection
                deactivated[index] = Time::maxVal();
                source_info[index].units = sunits;
                source_info[index].type = sunits;
                return true;
            }
            return false;
        }
        ++index;
    }
    // clear this since it isn't well defined what the units are once a new source is added
    inputUnits.clear();
    inputType.clear();
    input_sources.push_back(newSource);
    source_info.emplace_back(sourceName, stype, sunits);
    data_queues.resize(input_sources.size());
    current_data.resize(input_sources.size());
    current_data_time.resize(input_sources.size(), {Time::minVal(), 0});
    deactivated.push_back(Time::maxVal());
    has_target = true;
    return true;
}